

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * anon_unknown.dwarf_f89de::CreateIndex
                    (VmModule *module,SynBase *source,VmValue *arrayLength,VmValue *elementSize,
                    VmValue *value,VmValue *index,TypeBase *structType)

{
  VmInstruction *pVVar1;
  VmType type;
  VmType VVar2;
  VmValue *fourth;
  
  if (((arrayLength->type).type != VM_TYPE_INT) || ((arrayLength->type).size != 4)) {
    __assert_fail("arrayLength->type == VmType::Int",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x20d,
                  "VmValue *(anonymous namespace)::CreateIndex(VmModule *, SynBase *, VmValue *, VmValue *, VmValue *, VmValue *, TypeBase *)"
                 );
  }
  if (((elementSize->type).type == VM_TYPE_INT) && ((elementSize->type).size == 4)) {
    if ((value->type).type != VM_TYPE_POINTER) {
      __assert_fail("value->type.type == VM_TYPE_POINTER",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x20f,
                    "VmValue *(anonymous namespace)::CreateIndex(VmModule *, SynBase *, VmValue *, VmValue *, VmValue *, VmValue *, TypeBase *)"
                   );
    }
    if (((index->type).type == VM_TYPE_INT) && ((index->type).size == 4)) {
      fourth = (VmValue *)0x1872aa;
      VVar2 = VmType::Pointer(structType);
      type.structType = (TypeBase *)0x16;
      type._0_8_ = VVar2.structType;
      pVVar1 = CreateInstruction((anon_unknown_dwarf_f89de *)module,(VmModule *)source,VVar2._0_8_,
                                 type,(VmInstructionType)arrayLength,elementSize,value,index,fourth)
      ;
      return &pVVar1->super_VmValue;
    }
    __assert_fail("index->type == VmType::Int",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x210,
                  "VmValue *(anonymous namespace)::CreateIndex(VmModule *, SynBase *, VmValue *, VmValue *, VmValue *, VmValue *, TypeBase *)"
                 );
  }
  __assert_fail("elementSize->type == VmType::Int",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x20e,
                "VmValue *(anonymous namespace)::CreateIndex(VmModule *, SynBase *, VmValue *, VmValue *, VmValue *, VmValue *, TypeBase *)"
               );
}

Assistant:

VmInstructionType GetOperationWithLoad(VmInstructionType cmd)
	{
		switch(cmd)
		{
		case VM_INST_ADD:
			return VM_INST_ADD_LOAD;
		case VM_INST_SUB:
			return VM_INST_SUB_LOAD;
		case VM_INST_MUL:
			return VM_INST_MUL_LOAD;
		case VM_INST_DIV:
			return VM_INST_DIV_LOAD;
		case VM_INST_POW:
			return VM_INST_POW_LOAD;
		case VM_INST_MOD:
			return VM_INST_MOD_LOAD;
		case VM_INST_LESS:
			return VM_INST_LESS_LOAD;
		case VM_INST_GREATER:
			return VM_INST_GREATER_LOAD;
		case VM_INST_LESS_EQUAL:
			return VM_INST_LESS_EQUAL_LOAD;
		case VM_INST_GREATER_EQUAL:
			return VM_INST_GREATER_EQUAL_LOAD;
		case VM_INST_EQUAL:
			return VM_INST_EQUAL_LOAD;
		case VM_INST_NOT_EQUAL:
			return VM_INST_NOT_EQUAL_LOAD;
		case VM_INST_SHL:
			return VM_INST_SHL_LOAD;
		case VM_INST_SHR:
			return VM_INST_SHR_LOAD;
		case VM_INST_BIT_AND:
			return VM_INST_BIT_AND_LOAD;
		case VM_INST_BIT_OR:
			return VM_INST_BIT_OR_LOAD;
		case VM_INST_BIT_XOR:
			return VM_INST_BIT_XOR_LOAD;
		default:
			break;
		}

		assert(!"unknown operation");
		return VM_INST_ABORT_NO_RETURN;
	}